

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flute_mst.c
# Opt level: O1

Tree smergetree(Tree t1,Tree t2,int *o1,int *o2,int cx,int cy)

{
  Branch *pBVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  Branch *pBVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  uint uVar13;
  Branch *__ptr;
  int *piVar14;
  long lVar15;
  uint uVar16;
  Branch *__ptr_00;
  ulong uVar17;
  long lVar18;
  int iVar19;
  int iVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  long lVar24;
  bool bVar25;
  Tree t;
  Tree TVar26;
  int map [1000];
  int o [1000];
  int local_fd8 [1002];
  
  __ptr = t2.branch;
  __ptr_00 = t1.branch;
  uVar3 = t2.deg;
  uVar4 = t1.deg;
  pBVar8 = (Branch *)malloc((long)(int)((uVar3 + uVar4) * 2 + -2) * 0xc - 0x18);
  if ((int)uVar4 < 1) {
    uVar17 = 0;
  }
  else {
    piVar14 = &__ptr_00->y;
    uVar9 = 0;
    do {
      if ((((Branch *)(piVar14 + -1))->x == cx) && (uVar17 = uVar9, *piVar14 == cy)) break;
      uVar9 = uVar9 + 1;
      piVar14 = piVar14 + 3;
      uVar17 = t1._0_8_;
    } while ((uVar4 & 0x7fffffff) != uVar9);
    uVar17 = uVar17 & 0xffffffff;
  }
  iVar19 = uVar4 * 2 + -2;
  iVar20 = __ptr_00[uVar17].n;
  iVar7 = (int)((long)(int)uVar3 + -1);
  if ((__ptr_00[iVar20].x != cx) || (iVar5 = iVar19, __ptr_00[iVar20].y != cy)) {
    pBVar1 = __ptr_00 + uVar17;
    iVar12 = iVar19 + iVar7;
    iVar20 = pBVar1->n;
    pBVar8[iVar12].n = iVar20;
    iVar5 = pBVar1->y;
    pBVar8[iVar12].x = pBVar1->x;
    pBVar8[iVar12].y = iVar5;
    pBVar8[iVar12].n = iVar20 + iVar7;
    pBVar1->n = iVar19;
    iVar5 = uVar4 * 2 + -1;
    iVar20 = iVar19;
  }
  iVar12 = uVar3 * 2 + -2;
  if ((int)uVar3 < iVar12) {
    memset(local_fd8 + (long)(int)uVar3 + -1000,0xff,(t2._0_8_ * 4 + 0x3fffffff4 & 0x3fffffffc) + 4)
    ;
  }
  if ((int)uVar3 < 1) {
    uVar17 = 0;
  }
  else {
    piVar14 = &__ptr->y;
    uVar17 = 0;
    do {
      if ((((Branch *)(piVar14 + -1))->x == cx) && (*piVar14 == cy)) goto LAB_00129275;
      uVar17 = uVar17 + 1;
      piVar14 = piVar14 + 3;
    } while ((uVar3 & 0x7fffffff) != uVar17);
    uVar17 = t2._0_8_ & 0xffffffff;
  }
LAB_00129275:
  uVar16 = (uint)uVar17;
  uVar23 = __ptr[uVar17 & 0xffffffff].n;
  uVar17 = (ulong)(int)uVar23;
  pBVar1 = __ptr + uVar17;
  if ((pBVar1->x != cx) || (uVar13 = uVar23, pBVar1->y != cy)) {
    uVar13 = uVar16;
  }
  uVar21 = pBVar1->n;
  piVar14 = &__ptr[(int)uVar21].n;
  uVar9 = (long)(int)uVar21;
  uVar22 = *piVar14;
  if (uVar21 != *piVar14) {
    do {
      uVar23 = (uint)uVar9;
      *piVar14 = (int)uVar17;
      piVar14 = &__ptr[(int)uVar22].n;
      uVar17 = uVar9 & 0xffffffff;
      bVar25 = uVar22 != *piVar14;
      uVar9 = (ulong)uVar22;
      uVar22 = *piVar14;
    } while (bVar25);
  }
  *piVar14 = uVar23;
  pBVar1->n = uVar13;
  lVar15 = (long)(int)uVar13;
  if ((int)uVar3 < iVar12) {
    lVar10 = (long)(int)uVar3;
    do {
      if (lVar15 != lVar10) {
        local_fd8[lVar10 + -1000] = iVar5;
        iVar5 = iVar5 + 1;
      }
      lVar10 = lVar10 + 1;
    } while (iVar12 != lVar10);
  }
  uVar13 = (uVar3 + uVar4) - 1;
  local_fd8[lVar15 + -1000] = iVar20;
  uVar23 = (uint)(uVar16 == 0);
  uVar21 = 0;
  uVar22 = 0;
  do {
    if ((int)uVar23 < (int)uVar3) {
      lVar10 = (long)(int)uVar23;
      if ((int)uVar21 < (int)uVar4) {
        iVar20 = o1[(int)uVar21];
        iVar2 = o2[lVar10];
        pBVar1 = pBVar8 + (int)uVar22;
        if (iVar20 < iVar2) {
          pBVar1->n = __ptr_00[(int)uVar21].n;
          iVar2 = __ptr_00[(int)uVar21].y;
          pBVar1->x = __ptr_00[(int)uVar21].x;
          pBVar1->y = iVar2;
          pBVar1->n = __ptr_00[(int)uVar21].n + iVar7;
          local_fd8[(int)uVar22] = iVar20;
          uVar22 = uVar22 + 1;
          uVar21 = uVar21 + 1;
        }
        else {
          pBVar1->n = __ptr[lVar10].n;
          iVar20 = __ptr[lVar10].y;
          pBVar1->x = __ptr[lVar10].x;
          pBVar1->y = iVar20;
          pBVar1->n = local_fd8[(long)__ptr[lVar10].n + -1000] + iVar7;
          local_fd8[(int)uVar22] = iVar2;
          uVar22 = uVar22 + 1;
          uVar6 = uVar23 + 1;
          uVar23 = uVar23 + 2;
          if (uVar6 != uVar16) {
            uVar23 = uVar6;
          }
        }
      }
      else {
        piVar14 = &__ptr[lVar10].n;
        lVar11 = 0;
        do {
          if ((int)uVar16 - lVar10 != lVar11) {
            pBVar8[(int)uVar22].n = *piVar14;
            iVar20 = ((Branch *)(piVar14 + -2))->y;
            pBVar8[(int)uVar22].x = ((Branch *)(piVar14 + -2))->x;
            pBVar8[(int)uVar22].y = iVar20;
            pBVar8[(int)uVar22].n = local_fd8[(long)*piVar14 + -1000] + iVar7;
            local_fd8[(int)uVar22] = o2[lVar10 + lVar11];
            uVar22 = uVar22 + 1;
          }
          lVar11 = lVar11 + 1;
          piVar14 = piVar14 + 3;
        } while ((int)uVar3 - lVar10 != lVar11);
        uVar23 = uVar23 + (int)lVar11;
      }
    }
    else if ((int)uVar21 < (int)uVar4) {
      lVar24 = (long)(int)uVar22;
      lVar11 = (long)(int)uVar21;
      memcpy(local_fd8 + lVar24,o1 + lVar11,(ulong)(~uVar21 + uVar4) * 4 + 4);
      lVar18 = 8;
      lVar10 = 0;
      do {
        *(undefined4 *)((long)&pBVar8[lVar24].x + lVar18) =
             *(undefined4 *)((long)&__ptr_00[lVar11].x + lVar18);
        *(undefined8 *)((long)pBVar8 + lVar18 + lVar24 * 0xc + -8) =
             *(undefined8 *)((long)__ptr_00 + lVar18 + lVar11 * 0xc + -8);
        *(int *)((long)&pBVar8[lVar24].x + lVar18) =
             *(int *)((long)&__ptr_00[lVar11].x + lVar18) + iVar7;
        lVar18 = lVar18 + 0xc;
        lVar10 = lVar10 + -1;
      } while (lVar11 - (int)uVar4 != lVar10);
      uVar21 = uVar21 - (int)lVar10;
      uVar22 = uVar22 - (int)lVar10;
    }
  } while (((int)uVar21 < (int)uVar4) || ((int)uVar23 < (int)uVar3));
  if (0 < (int)uVar22) {
    memcpy(o1,local_fd8,(ulong)uVar22 << 2);
  }
  if ((int)uVar4 < iVar19) {
    lVar10 = (long)(int)uVar4 * 0xc + 8;
    lVar11 = (long)iVar19 - (long)(int)uVar4;
    do {
      *(undefined4 *)((long)&pBVar8[iVar7].x + lVar10) =
           *(undefined4 *)((long)&__ptr_00->x + lVar10);
      *(undefined8 *)((long)pBVar8 + lVar10 + (long)iVar7 * 0xc + -8) =
           *(undefined8 *)((long)__ptr_00 + lVar10 + -8);
      *(int *)((long)&pBVar8[iVar7].x + lVar10) = *(int *)((long)&__ptr_00->x + lVar10) + iVar7;
      lVar10 = lVar10 + 0xc;
      lVar11 = lVar11 + -1;
    } while (lVar11 != 0);
  }
  if ((int)uVar3 < iVar12) {
    lVar10 = (long)(int)uVar3;
    piVar14 = &__ptr[lVar10].n;
    do {
      if (lVar15 != lVar10) {
        lVar11 = (long)local_fd8[lVar10 + -1000] + (long)(int)uVar3 + -1;
        pBVar8[lVar11].n = *piVar14;
        iVar20 = ((Branch *)(piVar14 + -2))->y;
        pBVar8[lVar11].x = ((Branch *)(piVar14 + -2))->x;
        pBVar8[lVar11].y = iVar20;
        pBVar8[lVar11].n = local_fd8[(long)*piVar14 + -1000] + iVar7;
      }
      lVar10 = lVar10 + 1;
      piVar14 = piVar14 + 3;
    } while (iVar12 != lVar10);
  }
  iVar7 = iVar5 + iVar7;
  if (iVar7 < (int)((uVar3 + uVar4) * 2 + -4)) {
    piVar14 = &pBVar8[iVar7].n;
    iVar20 = ((uVar4 * 2 + uVar3) - iVar5) + -3;
    do {
      *piVar14 = __ptr->n;
      iVar19 = __ptr->y;
      ((Branch *)(piVar14 + -2))->x = __ptr->x;
      ((Branch *)(piVar14 + -2))->y = iVar19;
      *piVar14 = iVar7;
      iVar7 = iVar7 + 1;
      piVar14 = piVar14 + 3;
      iVar20 = iVar20 + -1;
    } while (iVar20 != 0);
  }
  free(__ptr_00);
  free(__ptr);
  t.length = 0;
  t.deg = uVar13;
  t.branch = pBVar8;
  iVar20 = wirelength(t);
  TVar26.length = iVar20;
  TVar26.deg = uVar13;
  TVar26.branch = pBVar8;
  return TVar26;
}

Assistant:

Tree smergetree(Tree t1, Tree t2, int *o1, int *o2,
		DTYPE cx, DTYPE cy)
{
  Tree t;
  int d, i, j, k, n, ci, cn, mapped_cn, prev, curr, next, offset;
#if MR_FOR_SMALL_CASES_ONLY
  int o[D2M+MAXPART], map[2*D2M];
#else
  int *o, *map;

  map = (int*)malloc(sizeof(int)*(t1.deg+t2.deg)*2);
  o = (int*)malloc(sizeof(int)*(t1.deg+t2.deg+MAXPART2));  
#endif

  t.deg = t1.deg + t2.deg - 1;
  t.branch = (Branch *) malloc((2*t.deg-2)*sizeof(Branch));

  offset = t2.deg - 1;
  d = t1.deg*2-2;

  for (i=0; i<t1.deg; i++) {
    if (t1.branch[i].x==cx && t1.branch[i].y==cy) {
      break;
    }
  }
  n = t1.branch[i].n;
  if (t1.branch[n].x==cx && t1.branch[n].y==cy) {
    mapped_cn = n;
  } else {
    t.branch[d+offset] = t1.branch[i];
    t.branch[d+offset].n += offset;
    t1.branch[i].n = d;
    mapped_cn = d;
    d++;
  }

  for (i=t2.deg; i<t2.deg*2-2; i++) {
    map[i] = -1;
  }
  for (i=0; i<t2.deg; i++) {
    if (t2.branch[i].x==cx && t2.branch[i].y==cy) {
      ci = i;
      break;
    }
  }

  n = t2.branch[i].n;

  if (t2.branch[n].x==cx && t2.branch[n].y==cy) {
    cn = n;
  } else {
    cn = i;
  }

  prev = n;
  curr = t2.branch[n].n;
  next = t2.branch[curr].n;
  while (curr != next) {
    t2.branch[curr].n = prev;
    prev = curr;
    curr = next;
    next = t2.branch[curr].n;
  }
  t2.branch[curr].n = prev;
  t2.branch[n].n = cn;

  for (i=t2.deg; i<2*t2.deg-2; i++) {
    if (i!=cn) {
      map[i] = d++;
    }
  }
  map[cn] = mapped_cn;

  /* merge the pin nodes in the correct order */
  j = i = k = 0;
  if (k==ci) { k++; }

  do {
    if (k>=t2.deg) {
      for (; i<t1.deg; i++) {
	t.branch[j] = t1.branch[i];
	t.branch[j].n = t1.branch[i].n + offset;
	o[j] = o1[i];
	j++;
      }
    } else if (i>=t1.deg) {
      for (; k<t2.deg; k++) {
	if (k==ci) {
	  continue;
	}
	t.branch[j] = t2.branch[k];
	n = t2.branch[k].n;
	t.branch[j].n = map[n] + offset;
	o[j] = o2[k];
	j++;
      }
    } else if (o1[i] < o2[k]) {
      t.branch[j] = t1.branch[i];
      t.branch[j].n = t1.branch[i].n + offset;
      o[j] = o1[i];
      j++;
      i++;
    } else {
      t.branch[j] = t2.branch[k];
      n = t2.branch[k].n;
      t.branch[j].n = map[n] + offset;
      o[j] = o2[k];
      j++;
      k++;
      if (k==ci) { k++; }
    }
  }while (i<t1.deg || k<t2.deg);
  //assert(j==t.deg);

  for (i=0; i<j; i++) {
    o1[i] = o[i];
  }

  for (i=t1.deg; i<t1.deg*2-2; i++) {
    t.branch[i+offset] = t1.branch[i];
    t.branch[i+offset].n = t1.branch[i].n + offset;
  }

  for (i=t2.deg; i<2*t2.deg-2; i++) {
    if (i != cn) {
      t.branch[map[i]+offset] = t2.branch[i];
      n = t2.branch[i].n;
      t.branch[map[i]+offset].n = map[n] + offset;
    }
  }

  for (i=d+offset; i<t.deg*2-2; i++) {
    t.branch[i] = t2.branch[0];
    t.branch[i].n = i;
  }

  free(t1.branch);
  free(t2.branch);

  t.length = wirelength(t);

#if !(MR_FOR_SMALL_CASES_ONLY)
  free(map); free(o);
#endif
  return t;
}